

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O0

void scan_bitstream_ace(TrackData *trackdata)

{
  pointer this;
  bool bVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  char *local_100;
  Header local_f8;
  undefined1 local_e8 [8];
  Sector sector;
  int local_9c;
  char *local_98;
  int local_8c;
  int local_88;
  uint local_84;
  int i;
  int clock;
  int parity;
  uint uStack_74;
  uint8_t data;
  int data_offset;
  int bit;
  undefined1 local_68 [3];
  bool dataerror;
  int idle;
  Data block;
  State state;
  uint32_t word;
  undefined1 local_38 [8];
  Track track;
  BitBuffer *bitbuf;
  TrackData *trackdata_local;
  
  track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)TrackData::bitstream(trackdata);
  BitBuffer::seek((BitBuffer *)
                  track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0);
  Track::Track((Track *)local_38,0);
  local_38._0_4_ =
       BitBuffer::track_bitsize
                 ((BitBuffer *)
                  track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  Data::Data((Data *)local_68);
  bit = 0;
  data_offset._3_1_ = 0;
  parity = 0;
LAB_001be58f:
  while( true ) {
    while( true ) {
      bVar1 = BitBuffer::wrapped((BitBuffer *)
                                 track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001be901;
      uVar2 = BitBuffer::read1((BitBuffer *)
                               track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = BitBuffer::read1((BitBuffer *)
                               track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = uVar2 * '\x02' | bVar3;
      if ((bVar3 & 2) != 0) break;
      BitBuffer::read1((BitBuffer *)
                       track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    }
    if (((bVar3 ^ 0xff) & 1) == 0) break;
    bit = bit + 1;
    if ((0x40 < bit) &&
       (block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 2)) {
LAB_001be901:
      if (block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 2) {
        iVar6 = SizeToCode(0x1000);
        Header::Header(&local_f8,&trackdata->cylhead,0,iVar6);
        Sector::Sector((Sector *)local_e8,_250K,Ace,&local_f8,0);
        sector.datarate = parity;
        bVar1 = IsValidDeepThoughtData((Data *)local_68);
        if (!bVar1) {
          local_100 = CH((trackdata->cylhead).cyl,(trackdata->cylhead).head);
          Message<char_const*>(msgWarning,"block checksum error on %s",&local_100);
          data_offset._3_1_ = 1;
        }
        Sector::add((Sector *)local_e8,(Data *)local_68,(bool)(data_offset._3_1_ & 1),'\0');
        Track::add((Track *)local_38,(Sector *)local_e8);
        Sector::~Sector((Sector *)local_e8);
      }
      TrackData::add(trackdata,(Track *)local_38);
      Data::~Data((Data *)local_68);
      Track::~Track((Track *)local_38);
      return;
    }
  }
  bit = 0;
  uStack_74 = 0;
  clock._3_1_ = 0;
  i = 1;
  local_84 = 2;
  for (local_88 = 0;
      this = track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage, local_88 < 10; local_88 = local_88 + 1) {
    bVar3 = BitBuffer::read1((BitBuffer *)
                             track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar4 = BitBuffer::read1((BitBuffer *)
                             track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar5 = (uint)bVar3 * 2 | (uint)bVar4;
    uStack_74 = (uVar5 ^ 0xffffffff) & 1;
    i = uStack_74 ^ i;
    local_84 = uVar5 & local_84;
    clock._3_1_ = clock._3_1_ | (byte)(uStack_74 << ((byte)local_88 & 0x1f));
  }
  if (((local_84 == 0) || (uStack_74 == 0)) || (i == 0)) {
    if (block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 2) goto LAB_001be58f;
    if (((data_offset._3_1_ & 1) == 0) || (opt.verbose != 0)) {
      data_offset._3_1_ = 1;
      if ((local_84 == 0) || (uStack_74 == 0)) {
        local_8c = Data::size((Data *)local_68);
        local_98 = CH((trackdata->cylhead).cyl,(trackdata->cylhead).head);
        Message<int,char_const*>
                  (msgWarning,"framing error at offset %u on on %s",&local_8c,&local_98);
      }
      else if (i == 0) {
        local_9c = Data::size((Data *)local_68);
        sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)CH((trackdata->cylhead).cyl,(trackdata->cylhead).head);
        Message<int,char_const*>
                  (msgWarning,"parity error at offset %u on on %s",&local_9c,
                   (char **)&sector.m_data.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  else if (block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    if (clock._3_1_ == 0xff) {
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    }
  }
  else if (block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ == 1) {
    if (clock._3_1_ == 0x2a) {
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
      iVar6 = BitBuffer::tell((BitBuffer *)
                              track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      parity = BitBuffer::track_offset((BitBuffer *)this,iVar6);
    }
    else if (clock._3_1_ != 0xff) {
      block.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
             (value_type *)((long)&clock + 3));
  goto LAB_001be58f;
}

Assistant:

void scan_bitstream_ace(TrackData& trackdata)
{
    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);

    Track track;
    track.tracklen = bitbuf.track_bitsize();

    uint32_t word = 0;

    enum State { stateWant255, stateWant42, stateData };
    State state = stateWant255;
    Data block;
    int idle = 0;
    bool dataerror = false;
    int bit;
    int data_offset = 0;

    while (!bitbuf.wrapped())
    {
        // Read the next clock and data bits
        word = (bitbuf.read1() << 1) | bitbuf.read1();

        // If the clock is missing, attempt to re-sync by skipping a bit
        if (!(word & 2))
        {
            bitbuf.read1();
            continue;
        }

        // Outside a frame a 1 represents the idle state
        if (~word & 1)
        {
            // Stop if we've found an idle patch after valid data
            if (++idle > 64 && state == stateData)
                break;

            // Ignore idle otherwise
            continue;
        }

        // The transition to 0 represents a potential start bit, so reset the idle count
        idle = 0;

        bit = 0;
        uint8_t data = 0;   // no data yet
        int parity = 1;     // odd parity
        int clock = 2;      // valid clock

        // Read 8 data bits, 1 parity bit, 1 stop bit
        for (int i = 0; i < 10; ++i)
        {
            // Fetch clock and data bits
            word = (bitbuf.read1() << 1) | bitbuf.read1();

            // Extract bit, update parity and clock status
            bit = ~word & 1;
            parity ^= bit;
            clock &= word;

            // Add data bit (lsb to msb order)
            data |= (bit << i) & 0xff;

        }

        // Check for errors
        if (!clock || !bit || !parity)
        {
            if (state != stateData)
                continue;

            // Report only first error during the data block, unless verbose
            if (!dataerror || opt.verbose)
            {
                dataerror = true;

                if (!clock || !bit)
                    Message(msgWarning, "framing error at offset %u on on %s", block.size(), CH(trackdata.cylhead.cyl, trackdata.cylhead.head));
                else if (!parity) // inverted due to inclusion of stop bit above
                    Message(msgWarning, "parity error at offset %u on on %s", block.size(), CH(trackdata.cylhead.cyl, trackdata.cylhead.head));
            }
        }
        else
        {
            switch (state)
            {
            case stateWant255:
                if (data == 255)
                    state = stateWant42;
                else
                    block.clear();
                break;

            case stateWant42:
                if (data == 42)
                {
                    state = stateData;
                    data_offset = bitbuf.track_offset(bitbuf.tell());
                }
                else if (data != 255)
                {
                    state = stateWant255;
                    block.clear();
                }
                break;

            default:
                break;
            }
        }

        // Save the byte
        block.push_back(data);
    }

    // If we found a block on the track, save it in a 4K sector with id=0.
    if (state == stateData)
    {
        Sector sector(DataRate::_250K, Encoding::Ace, Header(trackdata.cylhead, 0, SizeToCode(4096)));
        sector.offset = data_offset;

        // Skip header bytes
        if (!IsValidDeepThoughtData(block))
        {
            Message(msgWarning, "block checksum error on %s", CH(trackdata.cylhead.cyl, trackdata.cylhead.head));
            dataerror = true;
        }

        sector.add(std::move(block), dataerror, 0x00);
        track.add(std::move(sector));
    }

    trackdata.add(std::move(track));
}